

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

stbi_us * stbi_load_from_file_16(FILE *f,int *x,int *y,int *comp,int req_comp)

{
  undefined1 local_118 [8];
  stbi__context s;
  stbi__uint16 *result;
  int req_comp_local;
  int *comp_local;
  int *y_local;
  int *x_local;
  FILE *f_local;
  
  stbi__start_file((stbi__context *)local_118,f);
  s.img_buffer_original_end =
       (stbi_uc *)stbi__load_and_postprocess_16bit((stbi__context *)local_118,x,y,comp,req_comp);
  if ((stbi__uint16 *)s.img_buffer_original_end != (stbi__uint16 *)0x0) {
    fseek((FILE *)f,(long)-((int)s.img_buffer - s.callback_already_read),1);
  }
  return (stbi_us *)s.img_buffer_original_end;
}

Assistant:

STBIDEF stbi__uint16 *stbi_load_from_file_16(FILE *f, int *x, int *y, int *comp, int req_comp)
{
   stbi__uint16 *result;
   stbi__context s;
   stbi__start_file(&s,f);
   result = stbi__load_and_postprocess_16bit(&s,x,y,comp,req_comp);
   if (result) {
      // need to 'unget' all the characters in the IO buffer
      fseek(f, - (int) (s.img_buffer_end - s.img_buffer), SEEK_CUR);
   }
   return result;
}